

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiColumnsSet * FindOrAddColumnsSet(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumnsSet *pIVar1;
  ImVector<ImGuiColumnsSet> *this;
  ImGuiID in_ESI;
  long in_RDI;
  ImGuiColumnsSet *columns;
  int n;
  ImGuiColumnsSet *in_stack_ffffffffffffff78;
  ImGuiColumnsSet *in_stack_ffffffffffffff90;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x290) <= local_18) {
      this = (ImVector<ImGuiColumnsSet> *)(in_RDI + 0x290);
      ImGuiColumnsSet::ImGuiColumnsSet(in_stack_ffffffffffffff90);
      ImVector<ImGuiColumnsSet>::push_back(this,in_stack_ffffffffffffff78);
      ImGuiColumnsSet::~ImGuiColumnsSet((ImGuiColumnsSet *)0x14c191);
      pIVar1 = ImVector<ImGuiColumnsSet>::back((ImVector<ImGuiColumnsSet> *)(in_RDI + 0x290));
      pIVar1->ID = in_ESI;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiColumnsSet>::operator[]
                       ((ImVector<ImGuiColumnsSet> *)(in_RDI + 0x290),local_18);
    if (pIVar1->ID == in_ESI) break;
    local_18 = local_18 + 1;
  }
  pIVar1 = ImVector<ImGuiColumnsSet>::operator[]
                     ((ImVector<ImGuiColumnsSet> *)(in_RDI + 0x290),local_18);
  return pIVar1;
}

Assistant:

static ImGuiColumnsSet* FindOrAddColumnsSet(ImGuiWindow* window, ImGuiID id)
{
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumnsSet());
    ImGuiColumnsSet* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}